

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

ssize_t dma_write_aligned(nettlp *nt,uintptr_t addr,void *buf,size_t count,size_t mps)

{
  ssize_t sVar1;
  long in_RCX;
  ssize_t dma_len;
  ssize_t ret;
  size_t done;
  size_t len;
  uintptr_t dma_addr;
  long local_58;
  
  local_58 = in_RCX;
  do {
    sVar1 = dma_write((nettlp *)mps,dma_addr,(void *)len,done);
    if (sVar1 < 0) {
      return sVar1;
    }
    local_58 = local_58 - sVar1;
  } while (0 < local_58);
  return sVar1;
}

Assistant:

ssize_t
dma_write_aligned(struct nettlp *nt, uintptr_t addr, void *buf,
		  size_t count, size_t mps)
{
	uintptr_t dma_addr;
	size_t len, done;
	ssize_t ret, dma_len;

	done = 0;
	dma_addr = addr;
	dma_len = count;

	do {
		len = dma_len < mps ? dma_len : mps;
		ret = dma_write(nt, dma_addr, buf + done, len);
		if (ret < 0)
			return ret;

		/* for next iteration */
		done += ret;
		dma_addr += ret;
		dma_len -= ret;

	} while (dma_len > 0);

	return ret;
}